

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_clearModelImportsBeforeResolving_Test::TestBody
          (Importer_clearModelImportsBeforeResolving_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  element_type *peVar4;
  element_type *peVar5;
  AssertHelper local_1f8 [8];
  Message local_1f0 [8];
  unsigned_long local_1e8 [2];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  string local_1c0 [32];
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  shared_ptr<libcellml::Component> local_130;
  shared_ptr<libcellml::ImportSource> local_120;
  AssertHelper local_110 [8];
  Message local_108 [8];
  unsigned_long local_100 [2];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  string local_d8 [32];
  string local_b8 [32];
  undefined1 local_98 [8];
  ImporterPtr importer;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Importer_clearModelImportsBeforeResolving_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"importer/ImportCircularReferences.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  libcellml::Importer::create
            (SUB81((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_98,0));
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"importer/",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  resourcePath(local_b8);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)local_30);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_100[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_98);
  local_100[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_f0,"size_t(1)","importer->issueCount()",local_100 + 1,
             local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x367,pcVar3);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"controller",&local_151);
  libcellml::ComponentEntity::component((string *)&local_130,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_130);
  libcellml::ImportedEntity::importSource();
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"NotCircularReference.cellml",&local_179);
  libcellml::ImportSource::setUrl((string *)peVar5);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_120);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_130);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,"importer/",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  resourcePath(local_1a0);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)local_30);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_1e8[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_98);
  local_1e8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1d8,"size_t(0)","importer->issueCount()",local_1e8 + 1,
             local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x36f,pcVar3);
    testing::internal::AssertHelper::operator=(local_1f8,local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    testing::Message::~Message(local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::shared_ptr<libcellml::Importer>::~shared_ptr((shared_ptr<libcellml::Importer> *)local_98);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Importer, clearModelImportsBeforeResolving)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/ImportCircularReferences.cellml"));
    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));

    // Circular import issue generated.
    EXPECT_EQ(size_t(1), importer->issueCount());

    // Change URL away from circular import to the correct file.
    model->component("controller")->importSource()->setUrl("NotCircularReference.cellml");

    // Resolve imports again after clearing the issues.
    importer->resolveImports(model, resourcePath("importer/"));

    EXPECT_EQ(size_t(0), importer->issueCount());
}